

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

void __thiscall flatbuffers::ts::TsGenerator::generateEntry(TsGenerator *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
  *this_00;
  Parser *pPVar1;
  Namer *this_01;
  size_type sVar2;
  long *plVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  long lVar6;
  const_iterator cVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  long *plVar10;
  size_type *psVar11;
  ulong *puVar12;
  value_type *pvVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ts_file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> base_name;
  string import_extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ts_file_path_rel;
  string base_name_rel;
  string code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type_name;
  NsDefinition nsDef;
  string root;
  string fully_qualified_type_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rel_components;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  TsGenerator *local_208;
  _Base_ptr local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  _Base_ptr local_198;
  char *local_190;
  size_t local_188;
  char local_180;
  undefined7 uStack_17f;
  Namer *local_170;
  string local_168;
  key_type local_148;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  Namespace *local_e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
  local_e0;
  key_type local_b0;
  _Rb_tree_node_base *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_190 = &local_180;
  local_188 = 0;
  local_180 = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  this_00 = &this->ns_defs_;
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
          ::count(this_00,&local_b0);
  local_208 = this;
  if (sVar2 == 0) {
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity =
         local_148.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_120 = 0;
    local_118 = 0;
    local_100 = 0;
    local_f8 = 0;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_e0._M_impl.super__Rb_tree_header._M_header;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_128 = &local_118;
    local_108 = &local_f8;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_assign((string *)&local_148);
    std::__cxx11::string::_M_assign((string *)&local_108);
    std::operator+(&local_268,(this->super_BaseGenerator).path_,
                   (this->super_BaseGenerator).file_name_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_268);
    plVar10 = plVar3 + 2;
    if ((long *)*plVar3 == plVar10) {
      local_238 = *plVar10;
      lStack_230 = plVar3[3];
      local_248 = &local_238;
    }
    else {
      local_238 = *plVar10;
      local_248 = (long *)*plVar3;
    }
    local_240 = plVar3[1];
    *plVar3 = (long)plVar10;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_248);
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    this = local_208;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    local_e8 = (Namespace *)operator_new(0x20);
    (local_e8->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8->from_table = 0;
    (local_e8->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e8->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
             ::operator[](this_00,&local_148);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::_M_assign((string *)&pmVar4->filepath);
    std::__cxx11::string::_M_assign((string *)&pmVar4->symbolic_name);
    pmVar4->ns = local_e8;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
    ::operator=(&(pmVar4->definitions)._M_t,&local_e0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
    ::~_Rb_tree(&local_e0);
    if (local_108 != &local_f8) {
      operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var9 = (this->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_198 = &(this->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_198) {
    local_170 = &(this->namer_).super_Namer;
    do {
      pcVar5 = BaseGenerator::FlatBuffersGeneratedWarning();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,pcVar5,(allocator<char> *)&local_1d8);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x36dea7);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      psVar11 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_268.field_2._M_allocated_capacity = *psVar11;
        local_268.field_2._8_8_ = plVar3[3];
      }
      else {
        local_268.field_2._M_allocated_capacity = *psVar11;
        local_268._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_268._M_string_length = plVar3[1];
      *plVar3 = (long)psVar11;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_248 = &local_238;
      plVar10 = plVar3 + 2;
      if ((long *)*plVar3 == plVar10) {
        local_238 = *plVar10;
        lStack_230 = plVar3[3];
      }
      else {
        local_238 = *plVar10;
        local_248 = (long *)*plVar3;
      }
      local_240 = plVar3[1];
      *plVar3 = (long)plVar10;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_248);
      puVar12 = (ulong *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_148.field_2._M_allocated_capacity = *puVar12;
        local_148.field_2._8_8_ = plVar3[3];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar12;
        local_148._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_148._M_string_length = plVar3[1];
      *plVar3 = (long)puVar12;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_190,(string *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      p_Var8 = *(_Rb_tree_node_base **)(p_Var9 + 6);
      local_90 = (_Rb_tree_node_base *)&p_Var9[5]._M_left;
      iVar14 = 0;
      local_200 = p_Var9;
      if (p_Var8 != local_90) {
        do {
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar13 = (value_type *)**(long **)(local_200 + 5);
          lVar15 = (*(long **)(local_200 + 5))[1];
          lVar6 = lVar15 - (long)pvVar13;
          uVar16 = lVar6 >> 5;
          if (uVar16 < 2) {
            if (lVar6 == 0x20) {
              lVar15 = uVar16 + 1;
              do {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_48,pvVar13);
                pvVar13 = pvVar13 + 1;
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
          }
          else {
            pvVar13 = pvVar13 + 1;
            lVar15 = lVar15 - (long)pvVar13 >> 5;
            if (0 < lVar15) {
              lVar15 = lVar15 + 1;
              do {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_48,pvVar13);
                pvVar13 = pvVar13 + 1;
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
          }
          this_01 = local_170;
          (*local_170->_vptr_Namer[0xc])(&local_148,local_170,*(undefined8 *)(p_Var8 + 2),3);
          Namer::Directories(&local_268,this_01,
                             *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               **)(local_200 + 5),OutputPath,kUpperCamel);
          plVar3 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_268,(ulong)local_148._M_dataplus._M_p);
          local_248 = &local_238;
          plVar10 = plVar3 + 2;
          if ((long *)*plVar3 == plVar10) {
            local_238 = *plVar10;
            lStack_230 = plVar3[3];
          }
          else {
            local_238 = *plVar10;
            local_248 = (long *)*plVar3;
          }
          local_240 = plVar3[1];
          *plVar3 = (long)plVar10;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_268,local_248,local_240 + (long)local_248);
          std::__cxx11::string::append((char *)&local_268);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"./","");
          Namer::Directories(&local_1d8,local_170,&local_48,OutputPath,kUpperCamel);
          std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_1d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_148._M_dataplus._M_p);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,local_1b8._M_dataplus._M_p,
                     local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
          std::__cxx11::string::append((char *)&local_1d8);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,*(long *)(p_Var8 + 1),
                     (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
          Namespace::GetFullyQualifiedName(&local_68,*(Namespace **)(local_200 + 5),&local_168,1000)
          ;
          pPVar1 = (local_208->super_BaseGenerator).parser_;
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                          *)&pPVar1->structs_,&local_68);
          if ((_Rb_tree_header *)cVar7._M_node ==
              &(pPVar1->structs_).dict._M_t._M_impl.super__Rb_tree_header) {
            bVar17 = false;
          }
          else {
            bVar17 = *(long *)(cVar7._M_node + 2) != 0;
          }
          std::operator+(&local_228,"export { ",&local_168);
          std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_228._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((bVar17 & (((local_208->super_BaseGenerator).parser_)->opts).generate_object_based_api
              ) == 1) {
            std::operator+(&local_1f8,", ",&local_168);
            plVar3 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_1f8,
                                        (ulong)(((local_208->super_BaseGenerator).parser_)->opts).
                                               object_suffix._M_dataplus._M_p);
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            psVar11 = (size_type *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_228.field_2._M_allocated_capacity = *psVar11;
              local_228.field_2._8_8_ = plVar3[3];
            }
            else {
              local_228.field_2._M_allocated_capacity = *psVar11;
              local_228._M_dataplus._M_p = (pointer)*plVar3;
            }
            local_228._M_string_length = plVar3[1];
            *plVar3 = (long)psVar11;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_228._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::__cxx11::string::append((char *)&local_190);
          uVar16 = (ulong)(((local_208->super_BaseGenerator).parser_)->opts).ts_no_import_ext;
          pcVar5 = ".js";
          if (uVar16 != 0) {
            pcVar5 = "";
          }
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_228,pcVar5,pcVar5 + (uVar16 ^ 1) * 3);
          std::operator+(&local_88,&local_1b8,&local_228);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          psVar11 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_1f8.field_2._M_allocated_capacity = *psVar11;
            local_1f8.field_2._8_8_ = plVar3[3];
          }
          else {
            local_1f8.field_2._M_allocated_capacity = *psVar11;
            local_1f8._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_1f8._M_string_length = plVar3[1];
          *plVar3 = (long)psVar11;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_1f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if (local_248 != &local_238) {
            operator_delete(local_248,local_238 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          iVar14 = iVar14 + 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != local_90);
      }
      p_Var9 = (local_208->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var9 != local_198) {
        lVar15 = (*(long **)(local_200 + 5))[1];
        lVar6 = **(long **)(local_200 + 5);
        do {
          if ((*(long **)(p_Var9 + 5))[1] - **(long **)(p_Var9 + 5) >> 5 ==
              (lVar15 - lVar6 >> 5) + 1) {
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,*(long *)(p_Var9 + 2),
                       (long)&(p_Var9[2]._M_parent)->_M_color + *(long *)(p_Var9 + 2));
            std::__cxx11::string::append((char *)&local_148);
            std::operator+(&local_268,"export * as ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var9 + 4));
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_268);
            local_248 = &local_238;
            plVar10 = plVar3 + 2;
            if ((long *)*plVar3 == plVar10) {
              local_238 = *plVar10;
              lStack_230 = plVar3[3];
            }
            else {
              local_238 = *plVar10;
              local_248 = (long *)*plVar3;
            }
            local_240 = plVar3[1];
            *plVar3 = (long)plVar10;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_248);
            if (local_248 != &local_238) {
              operator_delete(local_248,local_238 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
            local_248 = &local_238;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_248,*(long *)(p_Var9 + 2),
                       (long)&(p_Var9[2]._M_parent)->_M_color + *(long *)(p_Var9 + 2));
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_268,local_248,local_240 + (long)local_248);
            std::__cxx11::string::append((char *)&local_268);
            std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_268._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_248 != &local_238) {
              operator_delete(local_248,local_238 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            iVar14 = iVar14 + 1;
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while (p_Var9 != local_198);
      }
      p_Var9 = local_200;
      if (0 < iVar14) {
        SaveFile(*(char **)(local_200 + 3),local_190,local_188,false);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_198);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
  }
  return;
}

Assistant:

void generateEntry() {
    std::string code;

    // add root namespace def if not already existing from defs tracking
    std::string root;
    if (ns_defs_.count(root) == 0) {
      NsDefinition nsDef;
      nsDef.path = root;
      nsDef.symbolic_name = file_name_;
      nsDef.filepath = path_ + file_name_ + ".ts";
      nsDef.ns = new Namespace();
      ns_defs_[nsDef.path] = nsDef;
    }

    for (const auto &it : ns_defs_) {
      code = "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n" +
        "/* eslint-disable @typescript-eslint/no-unused-vars, @typescript-eslint/no-explicit-any, @typescript-eslint/no-non-null-assertion */\n\n";
      
      // export all definitions in ns entry point module
      int export_counter = 0;
      for (const auto &def : it.second.definitions) {
        std::vector<std::string> rel_components;
        // build path for root level vs child level
        if (it.second.ns->components.size() > 1)
          std::copy(it.second.ns->components.begin() + 1,
                    it.second.ns->components.end(),
                    std::back_inserter(rel_components));
        else
          std::copy(it.second.ns->components.begin(),
                    it.second.ns->components.end(),
                    std::back_inserter(rel_components));
        auto base_file_name =
            namer_.File(*(def.second), SkipFile::SuffixAndExtension);
        auto base_name =
            namer_.Directories(it.second.ns->components, SkipDir::OutputPath) +
            base_file_name;
        auto ts_file_path = base_name + ".ts";
        auto base_name_rel = std::string("./");
        base_name_rel +=
            namer_.Directories(rel_components, SkipDir::OutputPath);
        base_name_rel += base_file_name;
        auto ts_file_path_rel = base_name_rel + ".ts";
        auto type_name = def.first;
        auto fully_qualified_type_name =
            it.second.ns->GetFullyQualifiedName(type_name);
        auto is_struct = parser_.structs_.Lookup(fully_qualified_type_name);
        code += "export { " + type_name;
        if (parser_.opts.generate_object_based_api && is_struct) {
          code += ", " + type_name + parser_.opts.object_suffix;
        }
        code += " } from '";
        std::string import_extension =
            parser_.opts.ts_no_import_ext ? "" : ".js";
        code += base_name_rel + import_extension + "';\n";
        export_counter++;
      }

      // re-export child namespace(s) in parent
      const auto child_ns_level = it.second.ns->components.size() + 1;
      for (const auto &it2 : ns_defs_) {
        if (it2.second.ns->components.size() != child_ns_level) continue;
        auto ts_file_path = it2.second.path + ".ts";
        code += "export * as " + it2.second.symbolic_name + " from './";
        std::string rel_path = it2.second.path;
        code += rel_path + ".js';\n";
        export_counter++;
      }

      if (export_counter > 0) SaveFile(it.second.filepath.c_str(), code, false);
    }
  }